

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O1

Regexp * re2::SimplifyWalker::SimplifyRepeat(Regexp *re,int min,int max,ParseFlags f)

{
  Regexp *pRVar1;
  Regexp *pRVar2;
  Regexp *re1;
  ostream *poVar3;
  ulong uVar4;
  int iVar5;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar6;
  string local_1d0;
  LogMessage local_1b0;
  
  if (max == -1) {
    if (min == 1) {
      pRVar1 = Regexp::Incref(re);
      pRVar1 = Regexp::Plus(pRVar1,f);
      return pRVar1;
    }
    if (min == 0) {
      pRVar1 = Regexp::Incref(re);
      pRVar1 = Regexp::Star(pRVar1,f);
      return pRVar1;
    }
    pRVar1 = (Regexp *)operator_new(0x28);
    Regexp::Regexp(pRVar1,kRegexpConcat,f);
    Regexp::AllocSub(pRVar1,min);
    if (pRVar1->nsub_ < 2) {
      paVar6 = &pRVar1->field_5;
    }
    else {
      paVar6 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(pRVar1->field_5).submany_;
    }
    if (1 < min) {
      uVar4 = 0;
      do {
        pRVar2 = Regexp::Incref(re);
        paVar6[uVar4].subone_ = pRVar2;
        uVar4 = uVar4 + 1;
      } while (min - 1U != uVar4);
    }
    pRVar2 = Regexp::Incref(re);
    pRVar2 = Regexp::Plus(pRVar2,f);
    paVar6[(int)(min - 1U)].subone_ = pRVar2;
  }
  else if (max == 0 && min == 0) {
    pRVar1 = (Regexp *)operator_new(0x28);
    Regexp::Regexp(pRVar1,kRegexpEmptyMatch,f);
  }
  else {
    if (max == 1 && min == 1) {
      pRVar1 = Regexp::Incref(re);
      return pRVar1;
    }
    if (min < 1) {
      pRVar2 = (Regexp *)0x0;
    }
    else {
      pRVar2 = (Regexp *)operator_new(0x28);
      Regexp::Regexp(pRVar2,kRegexpConcat,f);
      Regexp::AllocSub(pRVar2,min);
      if (pRVar2->nsub_ < 2) {
        paVar6 = &pRVar2->field_5;
      }
      else {
        paVar6 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(pRVar2->field_5).submany_;
      }
      uVar4 = 0;
      do {
        pRVar1 = Regexp::Incref(re);
        paVar6[uVar4].subone_ = pRVar1;
        uVar4 = uVar4 + 1;
      } while ((uint)min != uVar4);
    }
    pRVar1 = pRVar2;
    if (min < max) {
      pRVar1 = Regexp::Incref(re);
      pRVar1 = Regexp::Quest(pRVar1,f);
      if (min + 1 < max) {
        iVar5 = ~min + max;
        do {
          re1 = Regexp::Incref(re);
          pRVar1 = Concat2(re1,pRVar1,f);
          pRVar1 = Regexp::Quest(pRVar1,f);
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
      }
      if (pRVar2 != (Regexp *)0x0) {
        pRVar1 = Concat2(pRVar2,pRVar1,f);
      }
    }
    if (pRVar1 == (Regexp *)0x0) {
      LogMessage::LogMessage
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/simplify.cc",
                 0x277,3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1b0.str_,"Malformed repeat ",0x11);
      Regexp::ToString_abi_cxx11_(&local_1d0,re);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_1b0.str_,local_1d0._M_dataplus._M_p,
                          local_1d0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,min);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      std::ostream::operator<<((ostream *)poVar3,max);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p);
      }
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
      pRVar1 = (Regexp *)operator_new(0x28);
      Regexp::Regexp(pRVar1,kRegexpNoMatch,f);
    }
  }
  return pRVar1;
}

Assistant:

Regexp* SimplifyWalker::SimplifyRepeat(Regexp* re, int min, int max,
                                       Regexp::ParseFlags f) {
  // x{n,} means at least n matches of x.
  if (max == -1) {
    // Special case: x{0,} is x*
    if (min == 0)
      return Regexp::Star(re->Incref(), f);

    // Special case: x{1,} is x+
    if (min == 1)
      return Regexp::Plus(re->Incref(), f);

    // General case: x{4,} is xxxx+
    Regexp* nre = new Regexp(kRegexpConcat, f);
    nre->AllocSub(min);
    Regexp** nre_subs = nre->sub();
    for (int i = 0; i < min-1; i++)
      nre_subs[i] = re->Incref();
    nre_subs[min-1] = Regexp::Plus(re->Incref(), f);
    return nre;
  }

  // Special case: (x){0} matches only empty string.
  if (min == 0 && max == 0)
    return new Regexp(kRegexpEmptyMatch, f);

  // Special case: x{1} is just x.
  if (min == 1 && max == 1)
    return re->Incref();

  // General case: x{n,m} means n copies of x and m copies of x?.
  // The machine will do less work if we nest the final m copies,
  // so that x{2,5} = xx(x(x(x)?)?)?

  // Build leading prefix: xx.  Capturing only on the last one.
  Regexp* nre = NULL;
  if (min > 0) {
    nre = new Regexp(kRegexpConcat, f);
    nre->AllocSub(min);
    Regexp** nre_subs = nre->sub();
    for (int i = 0; i < min; i++)
      nre_subs[i] = re->Incref();
  }

  // Build and attach suffix: (x(x(x)?)?)?
  if (max > min) {
    Regexp* suf = Regexp::Quest(re->Incref(), f);
    for (int i = min+1; i < max; i++)
      suf = Regexp::Quest(Concat2(re->Incref(), suf, f), f);
    if (nre == NULL)
      nre = suf;
    else
      nre = Concat2(nre, suf, f);
  }

  if (nre == NULL) {
    // Some degenerate case, like min > max, or min < max < 0.
    // This shouldn't happen, because the parser rejects such regexps.
    LOG(DFATAL) << "Malformed repeat " << re->ToString() << " " << min << " " << max;
    return new Regexp(kRegexpNoMatch, f);
  }

  return nre;
}